

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

int RookMobility(Situation *s)

{
  uint position;
  int iVar1;
  int iVar2;
  int iVar3;
  int *in_RDI;
  int get_row_2;
  int get_row_1;
  int get_col_2;
  int get_col_1;
  int row;
  int col;
  int piece_from;
  int i;
  int r;
  int rook_mobility [2];
  int SideTag;
  int local_1c;
  int local_18;
  int local_14 [3];
  int *local_8;
  
  local_8 = in_RDI;
  memset(local_14,0,8);
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    local_14[2] = local_18 * 0x10 + 0x10;
    for (local_1c = 7; local_1c < 9; local_1c = local_1c + 1) {
      if (*(char *)((long)local_8 + (long)(local_14[2] + local_1c) + 0x104) != '\0') {
        position = (uint)*(byte *)((long)local_8 + (long)(local_14[2] + local_1c) + 0x104);
        iVar1 = GetCol(position);
        iVar2 = GetRow(position);
        iVar3 = (uint)ROOK_CANNON_CAN_GET_ROW[iVar1 + -3]
                      [*(ushort *)((long)local_8 + (long)iVar2 * 2 + 0x134)].no_capture[0] -
                (uint)*(byte *)((long)(iVar1 + -3) * 0x1000 + 0x313d81 +
                               (ulong)*(ushort *)((long)local_8 + (long)iVar2 * 2 + 0x134) * 8);
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        local_14[local_18] = iVar3 + local_14[local_18];
        iVar3 = (uint)ROOK_CANNON_CAN_GET_COL[iVar2 + -3]
                      [*(ushort *)((long)local_8 + (long)iVar1 * 2 + 0x154)].no_capture[0] -
                (uint)*(byte *)((long)(iVar2 + -3) * 0x2000 + 0x31cd81 +
                               (ulong)*(ushort *)((long)local_8 + (long)iVar1 * 2 + 0x154) * 8);
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        local_14[local_18] = iVar3 + local_14[local_18];
      }
    }
  }
  iVar3 = SideValue(*local_8,local_14[0] - local_14[1]);
  return iVar3;
}

Assistant:

int RookMobility(Situation &s)
{
    int SideTag;
    int rook_mobility[2] = {0};
    for (int r = 0; r < 2; r++)
    {
        SideTag = 16 + (r << 4);
        for (int i = 7; i <= 8; i++)
        {
            if (s.current_pieces[SideTag + i] != 0)
            {
                int piece_from = s.current_pieces[SideTag + i];
                int col = GetCol(piece_from), row = GetRow(piece_from);

                int get_col_1 = ROOK_CANNON_CAN_GET_ROW[col - 3][s.bit_row[row]].no_capture[0]; //右方向
                int get_col_2 = ROOK_CANNON_CAN_GET_ROW[col - 3][s.bit_row[row]].no_capture[1]; //左方向
                rook_mobility[r] += abs(get_col_1 - get_col_2);

                int get_row_1 = ROOK_CANNON_CAN_GET_COL[row - 3][s.bit_col[col]].no_capture[0]; //下方向
                int get_row_2 = ROOK_CANNON_CAN_GET_COL[row - 3][s.bit_col[col]].no_capture[1]; //上方向
                rook_mobility[r] += abs(get_row_1 - get_row_2);
            }
        }
    }

    return SideValue(s.current_player, rook_mobility[RED] - rook_mobility[BLACK]);
}